

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void round_shift_32_8xn_avx2(__m256i *in,int size,int bit,int stride)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  
  if (bit < 0) {
    iVar4 = 1 << (~(byte)bit & 0x1f);
    auVar6._4_4_ = iVar4;
    auVar6._0_4_ = iVar4;
    auVar6._8_4_ = iVar4;
    auVar6._12_4_ = iVar4;
    auVar6._16_4_ = iVar4;
    auVar6._20_4_ = iVar4;
    auVar6._24_4_ = iVar4;
    auVar6._28_4_ = iVar4;
    uVar3 = 0;
    if (0 < size) {
      uVar3 = (ulong)(uint)size;
    }
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      auVar1 = vpaddd_avx2(auVar6,(undefined1  [32])*in);
      alVar2 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)-bit));
      *in = alVar2;
      in = in + stride;
    }
  }
  else if (bit != 0) {
    uVar3 = 0;
    if (0 < size) {
      uVar3 = (ulong)(uint)size;
    }
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      alVar2 = (__m256i)vpslld_avx2((undefined1  [32])*in,ZEXT416((uint)bit));
      *in = alVar2;
      in = in + stride;
    }
  }
  return;
}

Assistant:

static inline void round_shift_32_8xn_avx2(__m256i *in, int size, int bit,
                                           int stride) {
  if (bit < 0) {
    bit = -bit;
    __m256i round = _mm256_set1_epi32(1 << (bit - 1));
    for (int i = 0; i < size; ++i) {
      in[stride * i] = _mm256_add_epi32(in[stride * i], round);
      in[stride * i] = _mm256_srai_epi32(in[stride * i], bit);
    }
  } else if (bit > 0) {
    for (int i = 0; i < size; ++i) {
      in[stride * i] = _mm256_slli_epi32(in[stride * i], bit);
    }
  }
}